

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<long_long>>
               (char *label_id,GetterXsYs<long_long> *getter,double width)

{
  ImPlotNextItemData *col;
  bool bVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col_00;
  ImU32 col_01;
  long lVar4;
  ImDrawList *this;
  long lVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_48;
  ImVec2 local_38;
  
  bVar3 = BeginItem(label_id,1);
  if (bVar3) {
    dVar9 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar6 = getter->Count, 0 < iVar6)) {
      iVar7 = 0;
      do {
        lVar4 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        dVar8 = (double)*(long *)((long)getter->Xs + lVar4);
        local_48.y = (double)*(long *)((long)getter->Ys + lVar4);
        local_48.x = dVar8 - dVar9;
        FitPoint(&local_48);
        local_48.x = dVar8 + dVar9;
        local_48.y = 0.0;
        FitPoint(&local_48);
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
    pIVar2 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 1);
    iVar6 = getter->Count;
    if (0 < iVar6) {
      bVar3 = (pIVar2->NextItemData).RenderFill;
      bVar1 = (pIVar2->NextItemData).RenderLine;
      iVar7 = 0;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        lVar4 = *(long *)((long)getter->Ys + lVar5);
        if (lVar4 != 0) {
          dVar8 = (double)*(long *)((long)getter->Xs + lVar5);
          local_48.x = (double)PlotToPixels(dVar8 - dVar9,(double)lVar4,-1);
          local_38 = PlotToPixels(dVar8 + dVar9,0.0,-1);
          if ((pIVar2->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_48,&local_38,col_01,0.0,0xf);
          }
          if (((bVar3 ^ 1U | col_00 != col_01) & bVar1) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_48,&local_38,col_00,0.0,0xf,
                                (pIVar2->NextItemData).LineWeight);
          }
          iVar6 = getter->Count;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar6);
    }
    pIVar2 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar2->NextItemData);
    pIVar2->PreviousItem = pIVar2->CurrentItem;
    pIVar2->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}